

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O0

void __thiscall KeySequentialExecutor::start(KeySequentialExecutor *this)

{
  thread *this_00;
  KeySequentialExecutor *local_40;
  code *local_38;
  undefined8 local_30;
  type local_28;
  KeySequentialExecutor *local_10;
  KeySequentialExecutor *this_local;
  
  local_10 = this;
  this_00 = (thread *)operator_new(8);
  local_38 = run;
  local_30 = 0;
  local_40 = this;
  std::bind<void(KeySequentialExecutor::*)(),KeySequentialExecutor*>
            (&local_28,(offset_in_KeySequentialExecutor_to_subr *)&local_38,&local_40);
  std::thread::thread<std::_Bind<void(KeySequentialExecutor::*(KeySequentialExecutor*))()>,,void>
            (this_00,&local_28);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset(&this->m_thread,this_00);
  return;
}

Assistant:

void KeySequentialExecutor::start()
{
    //std::cout << "KeySequentialExecutor " << m_name << " starting ..." << std::endl;
    m_thread.reset(new std::thread(std::bind(&KeySequentialExecutor::run, this)));
}